

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O2

Vec_Mem_t * Vec_MemAlloc(int nEntrySize,int LogPageSze)

{
  Vec_Mem_t *pVVar1;
  
  pVVar1 = (Vec_Mem_t *)calloc(1,0x30);
  pVVar1->nEntrySize = nEntrySize;
  pVVar1->LogPageSze = LogPageSze;
  pVVar1->PageMask = ~(-1 << ((byte)LogPageSze & 0x1f));
  pVVar1->iPage = -1;
  return pVVar1;
}

Assistant:

static inline Vec_Mem_t * Vec_MemAlloc( int nEntrySize, int LogPageSze )
{
    Vec_Mem_t * p;
    p = ABC_CALLOC( Vec_Mem_t, 1 );
    p->nEntrySize = nEntrySize;
    p->LogPageSze = LogPageSze;
    p->PageMask   = (1 << p->LogPageSze) - 1;
    p->iPage      = -1;
    return p;
}